

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

void __thiscall
CVmObjVector::remove_elements_undo
          (CVmObjVector *this,vm_obj_id_t self,size_t start_idx,size_t del_cnt)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  vm_val_t val;
  vm_val_t local_40;
  
  uVar3 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  if (start_idx < uVar3) {
    lVar2 = (del_cnt + start_idx) * 5 + 4;
    do {
      if (del_cnt + start_idx < uVar3) {
        pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
        local_40.typ = (vm_datatype_t)pcVar1[lVar2];
        vmb_get_dh_val(pcVar1 + lVar2,&local_40);
      }
      else {
        local_40.typ = VM_NIL;
      }
      set_element_undo(this,self,start_idx,&local_40);
      start_idx = start_idx + 1;
      lVar2 = lVar2 + 5;
    } while (uVar3 != start_idx);
  }
  set_element_count_undo(this,self,uVar3 - del_cnt);
  return;
}

Assistant:

void CVmObjVector::remove_elements_undo(VMG_ vm_obj_id_t self,
                                        size_t start_idx, size_t del_cnt)
{
    /* note the original size of the vector */
    size_t cnt = get_element_count();

    /* move all of the elements to their new slots, keeping undo */
    for (size_t idx = start_idx ; idx < cnt ; ++idx)
    {
        /* 
         *   calculate the index of the element to replace this one - it's
         *   past us by the number of items being deleted 
         */
        size_t move_idx = idx + del_cnt;

        /* 
         *   if we're moving from a valid index in the old vector, get the
         *   element; otherwise, replace the value with nil (but still
         *   replace the value, since we want to keep undo for its original
         *   value) 
         */
        vm_val_t val;
        if (move_idx < cnt)
            get_element(move_idx, &val);
        else
            val.set_nil();

        /* store the element at its new position */
        set_element_undo(vmg_ self, idx, &val);
    }

    /*
     *   Reduce the size, keeping undo.  Note that it's important we do
     *   this last: undo is applied in reverse order, so when applying
     *   undo, we first want to increase the vector's size to its original
     *   size, then we want to apply the element value restorations.
     */
    set_element_count_undo(vmg_ self, cnt - del_cnt);
}